

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O2

optional<helics::ActionMessage> * __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
          (optional<helics::ActionMessage> *__return_storage_ptr__,
          SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  std::mutex::lock(&this->m_pullLock);
  checkPullandSwap(this);
  if (((this->queueEmptyFlag)._M_base._M_i & 1U) == 0) {
    std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
              (__return_storage_ptr__,
               (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
              (&this->pullElements);
    checkPullandSwap(this);
  }
  else {
    (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload.
    super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
    super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  return __return_storage_ptr__;
}

Assistant:

std::optional<X> pop()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            checkPullandSwap();
            if (queueEmptyFlag) {
                return std::nullopt;
            }
            std::optional<X> val(
                std::move(pullElements.back()));  // do it this way to
                                                  // allow moveable only
                                                  // types
            pullElements.pop_back();
            checkPullandSwap();
            return val;
        }